

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedBrokerServer.cpp
# Opt level: O0

void helics::apps::TypedBrokerServer::assignPort
               (portData *pd,int pnumber,shared_ptr<helics::Broker> *brk)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<int,_bool,_shared_ptr<Broker>_>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<int,_bool,_shared_ptr<Broker>_>_> *p_Var3;
  shared_ptr<helics::Broker> *in_RDX;
  int in_ESI;
  tuple<int,_bool,_std::shared_ptr<helics::Broker>_> *pdi;
  iterator __end2;
  iterator __begin2;
  portData *__range2;
  vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_>
  local_28 [2];
  shared_ptr<helics::Broker> *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_28[0]._M_current =
       (tuple<int,_bool,_std::shared_ptr<helics::Broker>_> *)
       std::
       vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_>
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_>
    ::operator*(local_28);
    p_Var2 = std::get<0ul,int,bool,std::shared_ptr<helics::Broker>>
                       ((tuple<int,_bool,_std::shared_ptr<helics::Broker>_> *)0x1fbfaa);
    if (*p_Var2 == local_c) break;
    __gnu_cxx::
    __normal_iterator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_>
    ::operator++(local_28);
  }
  p_Var3 = std::get<1ul,int,bool,std::shared_ptr<helics::Broker>>
                     ((tuple<int,_bool,_std::shared_ptr<helics::Broker>_> *)0x1fbfbc);
  *p_Var3 = true;
  std::get<2ul,int,bool,std::shared_ptr<helics::Broker>>
            ((tuple<int,_bool,_std::shared_ptr<helics::Broker>_> *)0x1fbfd3);
  std::shared_ptr<helics::Broker>::operator=
            (local_18,(shared_ptr<helics::Broker> *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void TypedBrokerServer::assignPort(portData& pd, int pnumber, std::shared_ptr<Broker>& brk)
{
    for (auto& pdi : pd) {
        if (std::get<0>(pdi) == pnumber) {
            std::get<1>(pdi) = true;
            std::get<2>(pdi) = brk;
            break;
        }
    }
}